

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>
wasm::Builder::makeMemory(Name name,Address initial,Address max,bool shared,Type indexType)

{
  pointer pMVar1;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> this;
  undefined7 in_register_00000081;
  uintptr_t in_stack_00000008;
  bool shared_local;
  Type indexType_local;
  Address max_local;
  Address initial_local;
  Name name_local;
  __single_object *memory;
  
  initial_local.addr = name.super_IString.str._M_str;
  this.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl = name.super_IString.str._M_len;
  std::make_unique<wasm::Memory>();
  pMVar1 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                     ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                      this.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl);
  Name::operator=((Name *)pMVar1,(Name *)&initial_local);
  pMVar1 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                     ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                      this.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl);
  (pMVar1->initial).addr = max.addr;
  pMVar1 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                     ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                      this.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl);
  (pMVar1->max).addr = CONCAT71(in_register_00000081,shared);
  pMVar1 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                     ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                      this.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl);
  pMVar1->shared = (bool)((byte)indexType.id & 1);
  pMVar1 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                     ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                      this.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl);
  (pMVar1->indexType).id = in_stack_00000008;
  return (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
         (tuple<wasm::Memory_*,_std::default_delete<wasm::Memory>_>)
         this.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<Memory> makeMemory(Name name,
                                            Address initial = 0,
                                            Address max = Memory::kMaxSize32,
                                            bool shared = false,
                                            Type indexType = Type::i32) {
    auto memory = std::make_unique<Memory>();
    memory->name = name;
    memory->initial = initial;
    memory->max = max;
    memory->shared = shared;
    memory->indexType = indexType;
    return memory;
  }